

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O3

void FFSMarshalInstallMetadata(SstStream Stream,TSMetadataMsg MetaData)

{
  SstData p_Var1;
  ulong uVar2;
  FFSMetadataInfoStruct *pFVar3;
  TSMetadataMsg p_Var4;
  int iVar5;
  int iVar6;
  int iVar7;
  void *pvVar8;
  void *pvVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  char *pcVar12;
  long lVar13;
  long lVar14;
  long *plVar15;
  ulong uVar16;
  size_t sVar17;
  FFSVarRec_conflict pFVar18;
  char *pcVar19;
  FFSReaderMarshalBase *Info;
  undefined *puVar20;
  uint uVar21;
  undefined8 *puVar22;
  size_t sVar23;
  ulong uVar24;
  long lVar25;
  long *plVar26;
  long *plVar27;
  ulong *puVar28;
  int ElementSize;
  int Type;
  FFSMetadataInfoStruct *local_60;
  int local_54;
  int local_50;
  int local_4c;
  TSMetadataMsg local_48;
  void *local_40;
  void *local_38;
  
  FFSMarshalInstallPreciousMetadata(Stream,MetaData);
  uVar16 = (ulong)(uint)Stream->WriterCohortSize;
  if (Stream->WriterCohortSize < 1) {
    return;
  }
  lVar25 = 0;
  local_48 = MetaData;
LAB_00736425:
  p_Var4 = local_48;
  pvVar8 = Stream->ReaderMarshalData;
  if (pvVar8 == (void *)0x0) {
    pvVar8 = calloc(1,0x50);
    Stream->ReaderMarshalData = pvVar8;
    sVar23 = (size_t)(int)uVar16;
    pvVar9 = calloc(0x18,sVar23);
    *(void **)((long)pvVar8 + 0x40) = pvVar9;
    pvVar9 = calloc(8,sVar23);
    *(void **)((long)pvVar8 + 0x20) = pvVar9;
    pvVar9 = calloc(8,sVar23);
    *(void **)((long)pvVar8 + 0x28) = pvVar9;
    pvVar9 = calloc(8,sVar23);
    *(void **)((long)pvVar8 + 0x30) = pvVar9;
    pvVar9 = calloc(8,sVar23);
    *(void **)((long)pvVar8 + 0x38) = pvVar9;
  }
  pcVar12 = p_Var4->Metadata[lVar25].block;
  local_38 = pvVar8;
  if (pcVar12 == (char *)0x0) {
    fprintf(_stderr,"FAILURE!   MetaData->Metadata[WriterRank]->block == NULL for WriterRank = %d\n"
            ,lVar25);
    pcVar12 = p_Var4->Metadata[lVar25].block;
  }
  uVar10 = FFSTypeHandle_from_encode(Stream->ReaderFFSContext,pcVar12);
  iVar5 = FFShas_conversion(uVar10);
  if (iVar5 == 0) {
    uVar11 = FMContext_from_FFS(Stream->ReaderFFSContext);
    uVar11 = FMformat_from_ID(uVar11,p_Var4->Metadata[lVar25].block);
    uVar11 = format_list_of_FMFormat(uVar11);
    uVar11 = FMcopy_struct_list(uVar11);
    FMlocalize_structs(uVar11);
    establish_conversion(Stream->ReaderFFSContext,uVar10,uVar11);
    FMfree_struct_list(uVar11);
  }
  iVar5 = FFSdecode_in_place_possible(uVar10);
  p_Var1 = p_Var4->Metadata;
  if (iVar5 == 0) {
    sVar23 = FFS_est_decode_length
                       (Stream->ReaderFFSContext,p_Var1[lVar25].block,p_Var1[lVar25].DataSize);
    local_60 = (FFSMetadataInfoStruct *)malloc(sVar23);
    FFSdecode_to_buffer(Stream->ReaderFFSContext,p_Var4->Metadata[lVar25].block,local_60);
  }
  else {
    FFSdecode_in_place(Stream->ReaderFFSContext,p_Var1[lVar25].block,&local_60);
  }
  if (BuildVarList_DumpMetadata == 0xffffffff) {
    pcVar12 = getenv("SstDumpMetadata");
    BuildVarList_DumpMetadata = (uint)(pcVar12 != (char *)0x0);
  }
  if ((BuildVarList_DumpMetadata != 0) && (Stream->Rank == 0)) {
    printf("\nIncomingMetadatablock from WriterRank %d is %p :\n",lVar25,local_60);
    uVar11 = FMFormat_of_original(uVar10);
    FMdump_data(uVar11,local_60,0xfa000);
    puts("\n");
  }
  lVar13 = FMFormat_of_original(uVar10);
  for (plVar15 = *(long **)((long)Stream->ReaderMarshalData + 0x48); plVar15 != (long *)0x0;
      plVar15 = (long *)plVar15[2]) {
    if (*plVar15 == lVar13) {
      iVar5 = (int)plVar15[1];
      goto LAB_007366f1;
    }
  }
  lVar13 = FMFormat_of_original(uVar10);
  pvVar8 = Stream->ReaderMarshalData;
  lVar14 = format_list_of_FMFormat(lVar13);
  plVar27 = (long *)(*(long *)(lVar14 + 8) + -0x18);
  do {
    pcVar12 = (char *)plVar27[3];
    plVar27 = plVar27 + 3;
    iVar5 = strncmp(pcVar12,"BitField",8);
  } while (iVar5 == 0);
  while (local_40 = pvVar8, pcVar12 != (char *)0x0) {
    iVar5 = strncmp(pcVar12,"DataBlockSize",8);
    if (iVar5 != 0) {
      sVar23 = 0x38;
      plVar15 = (long *)malloc(0x38);
      *plVar15 = lVar13;
      iVar5 = 0;
      lVar13 = 0x30;
      iVar6 = 0;
      plVar26 = plVar27;
      goto LAB_00736995;
    }
    plVar15 = plVar27 + 3;
    plVar27 = plVar27 + 3;
    pvVar8 = local_40;
    pcVar12 = (char *)*plVar15;
  }
  plVar15 = (long *)malloc(0x38);
  *plVar15 = lVar13;
  iVar5 = 0;
  goto LAB_007366d3;
LAB_00736995:
  do {
    plVar15 = (long *)realloc(plVar15,sVar23);
    *(int *)((long)plVar15 + lVar13 + -0x18) = iVar6;
    *(undefined4 *)((long)plVar15 + lVar13 + -0x14) = *(undefined4 *)((long)plVar26 + 0x14);
    pcVar12 = (char *)*plVar26;
    local_54 = iVar6;
    sVar17 = strlen(pcVar12);
    iVar6 = strcmp("Dims",pcVar12 + (sVar17 - 4));
    if (iVar6 == 0) {
      *(undefined4 *)((long)plVar15 + lVar13 + -8) = 1;
      pcVar19 = strchr(pcVar12,0x5f);
      pcVar19 = strchr(pcVar19 + 1,0x5f);
      __isoc99_sscanf(pcVar12,"SST%d_%d_",&local_50,&local_4c);
      iVar7 = local_4c;
      iVar6 = local_50;
      pcVar12 = strdup(pcVar19 + 1);
      sVar17 = strlen(pcVar12);
      pcVar12[sVar17 - 4] = '\0';
      pFVar18 = LookupVarByName((SstStream)Stream->ReaderMarshalData,pcVar12);
      if (pFVar18 == (FFSVarRec_conflict)0x0) {
        pFVar18 = CreateVarRec(Stream,pcVar12);
        pFVar18->Type = iVar7;
        pFVar18->ElementSize = iVar6;
        *(int *)((long)plVar15 + lVar13) = iVar6;
      }
      iVar6 = local_54 + 5;
      free(pcVar12);
      *(FFSVarRec_conflict *)((long)plVar15 + lVar13 + -0x10) = pFVar18;
    }
    else {
      pcVar12 = strdup(pcVar12 + 4);
      *(undefined4 *)((long)plVar15 + lVar13 + -8) = 0;
      pFVar18 = LookupVarByName((SstStream)Stream->ReaderMarshalData,pcVar12);
      if (pFVar18 == (FFSVarRec_conflict)0x0) {
        pcVar19 = (char *)plVar26[1];
        iVar6 = (int)plVar26[2];
        iVar7 = strcmp(pcVar19,"integer");
        if (iVar7 == 0) {
          if (7 < iVar6 - 1U) goto LAB_00736bce;
          puVar20 = &DAT_0074c984;
LAB_00736bc5:
          iVar6 = *(int *)(puVar20 + (ulong)(iVar6 - 1) * 4);
        }
        else {
          iVar7 = strcmp(pcVar19,"unsigned integer");
          if (iVar7 == 0) {
            if (iVar6 - 1U < 8) {
              puVar20 = &DAT_0074c9a4;
              goto LAB_00736bc5;
            }
LAB_00736bce:
            iVar6 = 0;
          }
          else {
            iVar7 = strcmp(pcVar19,"double");
            if ((iVar7 == 0) || (iVar7 = strcmp(pcVar19,"float"), iVar7 == 0)) {
              iVar6 = (iVar6 != 4) + 9;
            }
            else {
              iVar6 = strcmp(pcVar19,"complex4");
              if (iVar6 == 0) {
                iVar6 = 0xc;
              }
              else {
                iVar6 = strcmp(pcVar19,"complex8");
                if (iVar6 != 0) goto LAB_00736bce;
                iVar6 = 0xd;
              }
            }
          }
        }
        pFVar18 = CreateVarRec(Stream,pcVar12);
        pFVar18->DimCount = 0;
        *(int *)((long)plVar15 + lVar13 + -4) = iVar6;
        pFVar18->Type = iVar6;
      }
      lVar14 = plVar26[2];
      pFVar18->ElementSize = (int)lVar14;
      *(int *)((long)plVar15 + lVar13) = (int)lVar14;
      *(FFSVarRec_conflict *)((long)plVar15 + lVar13 + -0x10) = pFVar18;
      free(pcVar12);
      iVar6 = local_54 + 1;
    }
    plVar26 = plVar27 + (long)iVar6 * 3;
    iVar5 = iVar5 + 1;
    lVar13 = lVar13 + 0x20;
    sVar23 = sVar23 + 0x38;
  } while (*plVar26 != 0);
LAB_007366d3:
  *(int *)(plVar15 + 1) = iVar5;
  plVar15[2] = *(long *)((long)local_40 + 0x48);
  *(long **)((long)local_40 + 0x48) = plVar15;
LAB_007366f1:
  *(FFSMetadataInfoStruct **)(*(long *)((long)local_38 + 0x20) + lVar25 * 8) = local_60;
  if (0 < iVar5) {
    lVar13 = 0;
    do {
      pFVar3 = local_60;
      lVar14 = (long)*(int *)((long)plVar15 + lVar13 * 0x20 + 0x1c);
      plVar27 = (long *)plVar15[lVar13 * 4 + 4];
      iVar5 = FFSBitfieldTest(local_60,(int)lVar13);
      if (iVar5 != 0) {
        puVar28 = (ulong *)((long)&pFVar3->BitFieldCount + lVar14);
        if ((int)plVar15[lVar13 * 4 + 5] == 0) {
          if (*plVar27 == 0) {
            pvVar8 = (*Stream->VarSetupUpcall)
                               (Stream->SetupUpcallReader,(char *)plVar27[1],(int)plVar27[4],puVar28
                               );
            *plVar27 = (long)pvVar8;
          }
        }
        else {
          uVar16 = *puVar28;
          if (((1 < uVar16) &&
              (Stream->WriterConfigParams->IsRowMajor != Stream->ConfigParams->IsRowMajor)) &&
             (1 < (int)(uint)uVar16)) {
            uVar2 = puVar28[2];
            puVar22 = (undefined8 *)(uVar2 + (ulong)((uint)uVar16 & 0x7fffffff) * 8);
            uVar24 = 0;
            do {
              puVar22 = puVar22 + -1;
              uVar10 = *(undefined8 *)(uVar2 + uVar24 * 8);
              *(undefined8 *)(uVar2 + uVar24 * 8) = *puVar22;
              *puVar22 = uVar10;
              uVar24 = uVar24 + 1;
            } while (((uint)(uVar16 >> 1) & 0x3fffffff) != uVar24);
            uVar16 = *puVar28;
            uVar21 = (uint)uVar16;
            if (1 < (int)uVar21) {
              uVar2 = puVar28[3];
              puVar22 = (undefined8 *)(uVar2 + (ulong)(uVar21 & 0x7fffffff) * 8);
              uVar24 = 0;
              do {
                puVar22 = puVar22 + -1;
                uVar10 = *(undefined8 *)(uVar2 + uVar24 * 8);
                *(undefined8 *)(uVar2 + uVar24 * 8) = *puVar22;
                *puVar22 = uVar10;
                uVar24 = uVar24 + 1;
              } while (((uint)(uVar16 >> 1) & 0x3fffffff) != uVar24);
              uVar16 = *puVar28;
              uVar21 = (uint)uVar16;
              if (1 < (int)uVar21) {
                uVar2 = puVar28[4];
                puVar22 = (undefined8 *)(uVar2 + (ulong)(uVar21 & 0x7fffffff) * 8);
                uVar24 = 0;
                do {
                  puVar22 = puVar22 + -1;
                  uVar10 = *(undefined8 *)(uVar2 + uVar24 * 8);
                  *(undefined8 *)(uVar2 + uVar24 * 8) = *puVar22;
                  *puVar22 = uVar10;
                  uVar24 = uVar24 + 1;
                } while (((uint)(uVar16 >> 1) & 0x3fffffff) != uVar24);
              }
            }
          }
          if (lVar25 == 0) {
            plVar27[5] = puVar28[2];
          }
          uVar16 = *puVar28;
          if (*plVar27 == 0) {
            pvVar8 = (*Stream->ArraySetupUpcall)
                               (Stream->SetupUpcallReader,(char *)plVar27[1],(int)plVar27[4],
                                (int)uVar16,(size_t *)puVar28[2],(size_t *)puVar28[4],
                                (size_t *)puVar28[3]);
            *plVar27 = (long)pvVar8;
            uVar16 = *puVar28;
          }
          plVar27[3] = uVar16;
          if (uVar16 == 0) {
            uVar16 = 1;
          }
          else {
            uVar16 = puVar28[1] / uVar16;
          }
          *(ulong *)(plVar27[7] + lVar25 * 8) = uVar16;
          *(ulong *)(plVar27[8] + lVar25 * 8) = puVar28[4];
          *(ulong *)(plVar27[9] + lVar25 * 8) = puVar28[3];
          if (lVar25 == 0) {
            *(undefined8 *)plVar27[6] = 0;
          }
          if (lVar25 < (long)Stream->WriterCohortSize + -1) {
            *(long *)(plVar27[6] + 8 + lVar25 * 8) =
                 *(long *)(plVar27[7] + lVar25 * 8) + *(long *)(plVar27[6] + lVar25 * 8);
          }
        }
        *(long *)(plVar27[2] + lVar25 * 8) = lVar14;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < (int)plVar15[1]);
  }
  lVar25 = lVar25 + 1;
  uVar16 = (ulong)Stream->WriterCohortSize;
  if ((long)uVar16 <= lVar25) {
    return;
  }
  goto LAB_00736425;
}

Assistant:

extern void FFSMarshalInstallMetadata(SstStream Stream, TSMetadataMsg MetaData)
{
    FFSMarshalInstallPreciousMetadata(Stream, MetaData);

    for (int i = 0; i < Stream->WriterCohortSize; i++)
    {
        BuildVarList(Stream, MetaData, i);
    }
}